

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SixAxisForceTorqueSensor.cpp
# Opt level: O2

bool __thiscall
iDynTree::SixAxisForceTorqueSensor::getWrenchAppliedOnLinkInverseMatrix
          (SixAxisForceTorqueSensor *this,LinkIndex link_index,
          Matrix6x6 *wrench_applied_on_link_inverse_matrix)

{
  bool bVar1;
  Transform sensor_H_link;
  Matrix6x6 *local_1c0 [2];
  CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Map<const_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>_>
  local_1b0 [5];
  double local_138 [36];
  
  if ((this->pimpl->link1 == link_index) || (this->pimpl->link2 == link_index)) {
    iDynTree::Transform::inverse();
    local_1c0[0] = wrench_applied_on_link_inverse_matrix;
    if (this->pimpl->appliedWrenchLink == link_index) {
      iDynTree::Transform::asAdjointTransformWrench();
      local_1b0[0].m_xpr.
      super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_data = local_138;
      Eigen::internal::
      call_assignment<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>,Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>const,0,Eigen::Stride<0,0>>>
                ((Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_> *)local_1c0,
                 &local_1b0[0].m_xpr);
    }
    else {
      iDynTree::Transform::asAdjointTransformWrench();
      local_1b0[0].m_xpr.
      super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_data = local_138;
      Eigen::internal::
      call_assignment<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>const,0,Eigen::Stride<0,0>>const>>
                ((Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_> *)local_1c0,
                 local_1b0);
    }
    bVar1 = true;
  }
  else {
    MatrixFixSize<6U,_6U>::zero(wrench_applied_on_link_inverse_matrix);
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool SixAxisForceTorqueSensor::getWrenchAppliedOnLinkInverseMatrix(const LinkIndex link_index,
                                                                   Matrix6x6& wrench_applied_on_link_inverse_matrix) const
{
    assert(this->isValid());

    if( link_index == this->pimpl->link1 )
    {
        Transform sensor_H_link = this->pimpl->link1_H_sensor.inverse();
        // If the measure wrench is the one applied on the other link, change sign
        if( this->getAppliedWrenchLink() != link_index )
        {
            toEigen(wrench_applied_on_link_inverse_matrix) = -toEigen(sensor_H_link.asAdjointTransformWrench());
        }
        else
        {
            toEigen(wrench_applied_on_link_inverse_matrix) = toEigen(sensor_H_link.asAdjointTransformWrench());
        }

        return true;
    }
    else if( link_index == this->pimpl->link2 )
    {
        Transform sensor_H_link = this->pimpl->link2_H_sensor.inverse();

        if( this->getAppliedWrenchLink() != link_index )
        {
            toEigen(wrench_applied_on_link_inverse_matrix) = -toEigen(sensor_H_link.asAdjointTransformWrench());
        }
        else
        {
            toEigen(wrench_applied_on_link_inverse_matrix) = toEigen(sensor_H_link.asAdjointTransformWrench());
        }

        return true;
    }
    else
    {
        assert(false);
        wrench_applied_on_link_inverse_matrix.zero();
        return false;
    }
}